

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void UYVYToARGBRow_SSSE3(uint8_t *uyvy_buf,uint8_t *dst_argb,YuvConstants *yuvconstants,int width)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  char cVar6;
  char cVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  ushort uVar55;
  undefined1 auVar56 [14];
  undefined1 auVar57 [12];
  unkbyte10 Var58;
  undefined1 auVar59 [14];
  undefined1 auVar60 [12];
  unkbyte10 Var61;
  undefined3 uVar62;
  unkbyte9 Var63;
  unkbyte9 Var64;
  uint uVar65;
  undefined1 auVar66 [11];
  undefined5 uVar67;
  unkbyte9 Var68;
  uint6 uVar69;
  undefined1 auVar70 [13];
  unkbyte9 Var71;
  undefined1 auVar72 [15];
  undefined6 uVar73;
  undefined4 uVar74;
  undefined2 uVar75;
  int iVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar91 [16];
  int width_local;
  YuvConstants *yuvconstants_local;
  uint8_t *dst_argb_local;
  uint8_t *uyvy_buf_local;
  undefined1 auVar79 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  
  auVar1 = *(undefined1 (*) [16])yuvconstants->kUVToB;
  auVar2 = *(undefined1 (*) [16])yuvconstants->kUVToG;
  auVar3 = *(undefined1 (*) [16])yuvconstants->kUVToR;
  sVar31 = yuvconstants->kUVBiasB[0];
  sVar32 = yuvconstants->kUVBiasB[1];
  sVar33 = yuvconstants->kUVBiasB[2];
  sVar34 = yuvconstants->kUVBiasB[3];
  sVar35 = yuvconstants->kUVBiasB[4];
  sVar36 = yuvconstants->kUVBiasB[5];
  sVar37 = yuvconstants->kUVBiasB[6];
  sVar38 = yuvconstants->kUVBiasB[7];
  sVar39 = yuvconstants->kUVBiasG[0];
  sVar40 = yuvconstants->kUVBiasG[1];
  sVar41 = yuvconstants->kUVBiasG[2];
  sVar42 = yuvconstants->kUVBiasG[3];
  sVar43 = yuvconstants->kUVBiasG[4];
  sVar44 = yuvconstants->kUVBiasG[5];
  sVar45 = yuvconstants->kUVBiasG[6];
  sVar46 = yuvconstants->kUVBiasG[7];
  sVar47 = yuvconstants->kUVBiasR[0];
  sVar48 = yuvconstants->kUVBiasR[1];
  sVar49 = yuvconstants->kUVBiasR[2];
  sVar50 = yuvconstants->kUVBiasR[3];
  sVar51 = yuvconstants->kUVBiasR[4];
  sVar52 = yuvconstants->kUVBiasR[5];
  sVar53 = yuvconstants->kUVBiasR[6];
  sVar54 = yuvconstants->kUVBiasR[7];
  auVar4 = *(undefined1 (*) [16])yuvconstants->kYToRgb;
  do {
    auVar91 = pshufb(*(undefined1 (*) [16])uyvy_buf,libyuv::kShuffleUYVYY._0_16_);
    auVar77 = pshufb(*(undefined1 (*) [16])uyvy_buf,libyuv::kShuffleUYVYUV._0_16_);
    uyvy_buf = (uint8_t *)((long)uyvy_buf + 0x10);
    auVar80 = pmaddubsw(auVar77,auVar1);
    auVar82._0_2_ = sVar31 - auVar80._0_2_;
    auVar82._2_2_ = sVar32 - auVar80._2_2_;
    auVar82._4_2_ = sVar33 - auVar80._4_2_;
    auVar82._6_2_ = sVar34 - auVar80._6_2_;
    auVar82._8_2_ = sVar35 - auVar80._8_2_;
    auVar82._10_2_ = sVar36 - auVar80._10_2_;
    auVar82._12_2_ = sVar37 - auVar80._12_2_;
    auVar82._14_2_ = sVar38 - auVar80._14_2_;
    auVar80 = pmaddubsw(auVar77,auVar2);
    auVar81._0_2_ = sVar39 - auVar80._0_2_;
    auVar81._2_2_ = sVar40 - auVar80._2_2_;
    auVar81._4_2_ = sVar41 - auVar80._4_2_;
    auVar81._6_2_ = sVar42 - auVar80._6_2_;
    auVar81._8_2_ = sVar43 - auVar80._8_2_;
    auVar81._10_2_ = sVar44 - auVar80._10_2_;
    auVar81._12_2_ = sVar45 - auVar80._12_2_;
    auVar81._14_2_ = sVar46 - auVar80._14_2_;
    auVar77 = pmaddubsw(auVar77,auVar3);
    auVar83._0_2_ = sVar47 - auVar77._0_2_;
    auVar83._2_2_ = sVar48 - auVar77._2_2_;
    auVar83._4_2_ = sVar49 - auVar77._4_2_;
    auVar83._6_2_ = sVar50 - auVar77._6_2_;
    auVar83._8_2_ = sVar51 - auVar77._8_2_;
    auVar83._10_2_ = sVar52 - auVar77._10_2_;
    auVar83._12_2_ = sVar53 - auVar77._12_2_;
    auVar83._14_2_ = sVar54 - auVar77._14_2_;
    auVar80 = pmulhuw(auVar91,auVar4);
    auVar77 = paddsw(auVar82,auVar80);
    auVar82 = paddsw(auVar81,auVar80);
    auVar80 = paddsw(auVar83,auVar80);
    auVar77 = psraw(auVar77,6);
    auVar82 = psraw(auVar82,6);
    auVar91 = psraw(auVar80,6);
    sVar8 = auVar77._0_2_;
    sVar10 = auVar77._2_2_;
    sVar13 = auVar77._4_2_;
    sVar16 = auVar77._6_2_;
    sVar19 = auVar77._8_2_;
    sVar22 = auVar77._10_2_;
    sVar25 = auVar77._12_2_;
    sVar28 = auVar77._14_2_;
    cVar6 = (0 < sVar28) * (sVar28 < 0x100) * auVar77[0xe] - (0xff < sVar28);
    sVar28 = auVar82._0_2_;
    sVar11 = auVar82._2_2_;
    sVar14 = auVar82._4_2_;
    sVar17 = auVar82._6_2_;
    sVar20 = auVar82._8_2_;
    sVar23 = auVar82._10_2_;
    sVar26 = auVar82._12_2_;
    sVar29 = auVar82._14_2_;
    sVar9 = auVar91._0_2_;
    sVar12 = auVar91._2_2_;
    sVar15 = auVar91._4_2_;
    sVar18 = auVar91._6_2_;
    sVar21 = auVar91._8_2_;
    sVar24 = auVar91._10_2_;
    sVar27 = auVar91._12_2_;
    sVar30 = auVar91._14_2_;
    cVar7 = (0 < sVar30) * (sVar30 < 0x100) * auVar91[0xe] - (0xff < sVar30);
    uVar55 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar91[0] - (0xff < sVar9),cVar7);
    auVar87._0_9_ = (unkuint9)uVar55 << 0x38;
    uVar62 = CONCAT12((0 < sVar12) * (sVar12 < 0x100) * auVar91[2] - (0xff < sVar12),uVar55);
    uVar65 = CONCAT13((0 < sVar15) * (sVar15 < 0x100) * auVar91[4] - (0xff < sVar15),uVar62);
    auVar66._4_7_ = 0;
    auVar66._0_4_ = uVar65;
    auVar88._0_11_ = auVar66 << 0x38;
    uVar67 = CONCAT14((0 < sVar18) * (sVar18 < 0x100) * auVar91[6] - (0xff < sVar18),uVar65);
    uVar69 = CONCAT15((0 < sVar21) * (sVar21 < 0x100) * auVar91[8] - (0xff < sVar21),uVar67);
    auVar70._6_7_ = 0;
    auVar70._0_6_ = uVar69;
    auVar89._0_13_ = auVar70 << 0x38;
    auVar72[6] = (0 < sVar24) * (sVar24 < 0x100) * auVar91[10] - (0xff < sVar24);
    auVar72._0_6_ = uVar69;
    uVar75 = CONCAT11((0 < sVar29) * (sVar29 < 0x100) * auVar82[0xe] - (0xff < sVar29),cVar6);
    uVar74 = CONCAT31(CONCAT21(uVar75,(0 < sVar26) * (sVar26 < 0x100) * auVar82[0xc] -
                                      (0xff < sVar26)),
                      (0 < sVar25) * (sVar25 < 0x100) * auVar77[0xc] - (0xff < sVar25));
    uVar73 = CONCAT51(CONCAT41(uVar74,(0 < sVar23) * (sVar23 < 0x100) * auVar82[10] -
                                      (0xff < sVar23)),
                      (0 < sVar22) * (sVar22 < 0x100) * auVar77[10] - (0xff < sVar22));
    Var63 = CONCAT72(CONCAT61(uVar73,(0 < sVar20) * (sVar20 < 0x100) * auVar82[8] - (0xff < sVar20))
                     ,CONCAT11((0 < sVar19) * (sVar19 < 0x100) * auVar77[8] - (0xff < sVar19),cVar6)
                    );
    Var58 = CONCAT91(CONCAT81((long)((unkuint9)Var63 >> 8),
                              (0 < sVar17) * (sVar17 < 0x100) * auVar82[6] - (0xff < sVar17)),
                     (0 < sVar16) * (sVar16 < 0x100) * auVar77[6] - (0xff < sVar16));
    auVar57._2_10_ = Var58;
    auVar57[1] = (0 < sVar14) * (sVar14 < 0x100) * auVar82[4] - (0xff < sVar14);
    auVar57[0] = (0 < sVar13) * (sVar13 < 0x100) * auVar77[4] - (0xff < sVar13);
    auVar56._2_12_ = auVar57;
    auVar56[1] = (0 < sVar11) * (sVar11 < 0x100) * auVar82[2] - (0xff < sVar11);
    auVar56[0] = (0 < sVar10) * (sVar10 < 0x100) * auVar77[2] - (0xff < sVar10);
    auVar77._0_2_ =
         CONCAT11((0 < sVar28) * (sVar28 < 0x100) * auVar82[0] - (0xff < sVar28),
                  (0 < sVar8) * (sVar8 < 0x100) * auVar77[0] - (0xff < sVar8));
    auVar77._2_14_ = auVar56;
    auVar72[7] = cVar7;
    auVar72._8_7_ = 0;
    auVar90._0_15_ = auVar72 << 0x38;
    auVar90[0xf] = 0xff;
    auVar89._14_2_ = auVar90._14_2_;
    auVar89[0xd] = 0xff;
    Var71 = CONCAT36(auVar89._13_3_,
                     CONCAT15((0 < sVar27) * (sVar27 < 0x100) * auVar91[0xc] - (0xff < sVar27),
                              uVar67));
    auVar88._12_4_ = (undefined4)((unkuint9)Var71 >> 0x28);
    auVar88[0xb] = 0xff;
    Var68 = CONCAT54(auVar88._11_5_,
                     CONCAT13((0 < sVar24) * (sVar24 < 0x100) * auVar91[10] - (0xff < sVar24),uVar62
                             ));
    auVar87._10_6_ = (undefined6)((unkuint9)Var68 >> 0x18);
    auVar87[9] = 0xff;
    Var64 = CONCAT72(auVar87._9_7_,
                     CONCAT11((0 < sVar21) * (sVar21 < 0x100) * auVar91[8] - (0xff < sVar21),cVar7))
    ;
    auVar86._8_8_ = (undefined8)((unkuint9)Var64 >> 8);
    auVar86._0_8_ = 0xff00000000000000;
    Var61 = CONCAT91(auVar86._7_9_,(0 < sVar18) * (sVar18 < 0x100) * auVar91[6] - (0xff < sVar18));
    auVar85._6_10_ = Var61;
    auVar85._0_6_ = 0xff0000000000;
    auVar60._1_11_ = auVar85._5_11_;
    auVar60[0] = (0 < sVar15) * (sVar15 < 0x100) * auVar91[4] - (0xff < sVar15);
    auVar84._4_12_ = auVar60;
    auVar84._0_4_ = 0xff000000;
    auVar59._1_13_ = auVar84._3_13_;
    auVar59[0] = (0 < sVar12) * (sVar12 < 0x100) * auVar91[2] - (0xff < sVar12);
    auVar80[3] = 0xff;
    auVar80[2] = (0 < sVar9) * (sVar9 < 0x100) * auVar91[0] - (0xff < sVar9);
    auVar79._0_12_ = auVar77._0_12_;
    auVar79._12_2_ = (short)Var58;
    auVar79._14_2_ = (short)Var61;
    auVar78._12_4_ = auVar79._12_4_;
    auVar78._0_10_ = auVar77._0_10_;
    auVar78._10_2_ = auVar60._0_2_;
    auVar91._10_6_ = auVar78._10_6_;
    auVar91._0_8_ = auVar77._0_8_;
    auVar91._8_2_ = auVar57._0_2_;
    auVar80._8_8_ = auVar91._8_8_;
    auVar80._6_2_ = auVar59._0_2_;
    auVar80._4_2_ = auVar56._0_2_;
    auVar80._0_2_ = auVar77._0_2_;
    *(undefined1 (*) [16])dst_argb = auVar80;
    *(short *)*(undefined1 (*) [16])((long)dst_argb + 0x10) = (short)((unkuint9)Var63 >> 8);
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 2) = (short)((unkuint9)Var64 >> 8);
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 4) = (short)uVar73;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 6) = (short)((unkuint9)Var68 >> 0x18)
    ;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 8) = (short)uVar74;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 10) =
         (short)((unkuint9)Var71 >> 0x28);
    *(undefined2 *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 0xc) = uVar75;
    *(undefined2 *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 0xe) = auVar89._14_2_;
    dst_argb = (uint8_t *)((long)dst_argb + 0x20);
    iVar76 = width + -8;
    bVar5 = 7 < width;
    width = iVar76;
  } while (iVar76 != 0 && bVar5);
  return;
}

Assistant:

void OMITFP UYVYToARGBRow_SSSE3(const uint8_t* uyvy_buf,
                                uint8_t* dst_argb,
                                const struct YuvConstants* yuvconstants,
                                int width) {
  // clang-format off
  asm volatile (
    YUVTORGB_SETUP(yuvconstants)
      "pcmpeqb     %%xmm5,%%xmm5                 \n"

    LABELALIGN
      "1:                                        \n"
    READUYVY
    YUVTORGB(yuvconstants)
    STOREARGB
      "sub         $0x8,%[width]                 \n"
      "jg          1b                            \n"
  : [uyvy_buf]"+r"(uyvy_buf),    // %[uyvy_buf]
    [dst_argb]"+r"(dst_argb),  // %[dst_argb]
    [width]"+rm"(width)    // %[width]
  : [yuvconstants]"r"(yuvconstants), // %[yuvconstants]
    [kShuffleUYVYY]"m"(kShuffleUYVYY),
    [kShuffleUYVYUV]"m"(kShuffleUYVYUV)
    : "memory", "cc", YUVTORGB_REGS
      "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5"
  );
  // clang-format on
}